

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplesort.hpp
# Opt level: O1

vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> * __thiscall
mxx::impl::
sample_arbit_decomp<__gnu_cxx::__normal_iterator<TwoBSA<unsigned_long>*,std::vector<TwoBSA<unsigned_long>,std::allocator<TwoBSA<unsigned_long>>>>,std::less<TwoBSA<unsigned_long>>>
          (vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
           *__return_storage_ptr__,impl *this,long begin,int param_4,long param_5,undefined8 param_6
          )

{
  undefined8 *puVar1;
  int iVar2;
  undefined8 uVar3;
  _func_int *p_Var4;
  pointer pTVar5;
  ulong uVar6;
  _func_int **pp_Var7;
  long lVar8;
  comm *comm;
  long lVar9;
  size_type __new_size;
  size_t local_size;
  vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> all_samples;
  ulong local_88;
  undefined8 local_80;
  ulong local_78;
  custom_op<unsigned_long,_true> local_70;
  
  local_88 = (begin - (long)this >> 3) * -0x5555555555555555;
  local_80 = param_6;
  custom_op<unsigned_long,true>::custom_op<std::plus<unsigned_long>>
            ((custom_op<unsigned_long,true> *)&local_70);
  comm = *(comm **)(param_5 + 8);
  MPI_Allreduce(&local_88,&local_78,1,local_70.m_type_copy,local_70.m_op);
  custom_op<unsigned_long,_true>::~custom_op(&local_70);
  iVar2 = *(int *)(param_5 + 0x10);
  lVar9 = (long)iVar2;
  if (local_88 == 0) {
    __new_size = 0;
  }
  else {
    uVar6 = (local_78 + local_88 * (long)param_4 * lVar9) - 1;
    __new_size = 1;
    if (local_78 <= uVar6) {
      __new_size = uVar6 / local_78;
    }
  }
  (__return_storage_ptr__->
  super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (__new_size != 0) {
    std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::resize
              (__return_storage_ptr__,__new_size);
    pTVar5 = (__return_storage_ptr__->
             super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    if ((__return_storage_ptr__->
        super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>)._M_impl.
        super__Vector_impl_data._M_finish != pTVar5) {
      lVar8 = 0;
      uVar6 = 0;
      do {
        this = this + ((local_88 / (__new_size + 1) - 1) +
                      (ulong)(uVar6 < local_88 % (__new_size + 1))) * 0x18 + 0x18;
        *(undefined8 *)((long)&pTVar5->SA + lVar8) = *(undefined8 *)(this + -8);
        uVar3 = *(undefined8 *)(this + -0x10);
        puVar1 = (undefined8 *)((long)&pTVar5->B1 + lVar8);
        *puVar1 = *(undefined8 *)(this + -0x18);
        puVar1[1] = uVar3;
        uVar6 = uVar6 + 1;
        pTVar5 = (__return_storage_ptr__->
                 super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>)
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar8 = lVar8 + 0x18;
      } while (uVar6 < (ulong)(((long)(__return_storage_ptr__->
                                      super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                                      )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar5 >>
                               3) * -0x5555555555555555));
    }
  }
  pTVar5 = (__return_storage_ptr__->
           super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  gatherv<TwoBSA<unsigned_long>>
            ((vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_> *)&local_70,
             (mxx *)pTVar5,
             (TwoBSA<unsigned_long> *)
             (((long)(__return_storage_ptr__->
                     super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar5 >> 3) *
             -0x5555555555555555),0,(int)param_5,comm);
  if (*(int *)(param_5 + 0x14) == 0) {
    if (local_70._vptr_custom_op !=
        (_func_int **)local_70.m_user_func.super__Function_base._M_functor._M_unused._0_8_) {
      uVar6 = ((long)local_70.m_user_func.super__Function_base._M_functor._M_unused._0_8_ -
               (long)local_70._vptr_custom_op >> 3) * -0x5555555555555555;
      lVar8 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar8 == 0; lVar8 = lVar8 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<TwoBSA<unsigned_long>*,std::vector<TwoBSA<unsigned_long>,std::allocator<TwoBSA<unsigned_long>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<std::less<TwoBSA<unsigned_long>>>>
                (local_70._vptr_custom_op,
                 local_70.m_user_func.super__Function_base._M_functor._M_unused._M_object,
                 ((uint)lVar8 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<TwoBSA<unsigned_long>*,std::vector<TwoBSA<unsigned_long>,std::allocator<TwoBSA<unsigned_long>>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<TwoBSA<unsigned_long>>>>
                ();
    }
    if (((long)(__return_storage_ptr__->
               super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>).
               _M_impl.super__Vector_impl_data._M_finish -
         (long)(__return_storage_ptr__->
               super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>).
               _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - (lVar9 + -1)
        != 0) {
      std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::resize
                (__return_storage_ptr__,(long)(iVar2 + -1));
    }
    pTVar5 = (__return_storage_ptr__->
             super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    if ((__return_storage_ptr__->
        super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>)._M_impl.
        super__Vector_impl_data._M_finish != pTVar5) {
      pp_Var7 = local_70._vptr_custom_op + ((long)param_4 + -1) * 3;
      lVar8 = 0;
      uVar6 = 0;
      do {
        *(_func_int **)((long)&pTVar5->SA + lVar8) = pp_Var7[2];
        p_Var4 = pp_Var7[1];
        puVar1 = (undefined8 *)((long)&pTVar5->B1 + lVar8);
        *puVar1 = *pp_Var7;
        puVar1[1] = p_Var4;
        uVar6 = uVar6 + 1;
        pTVar5 = (__return_storage_ptr__->
                 super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>)
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar8 = lVar8 + 0x18;
        pp_Var7 = pp_Var7 + (long)param_4 * 3;
      } while (uVar6 < (ulong)(((long)(__return_storage_ptr__->
                                      super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                                      )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar5 >>
                               3) * -0x5555555555555555));
    }
  }
  if (((long)(__return_storage_ptr__->
             super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>).
             _M_impl.super__Vector_impl_data._M_finish -
       (long)(__return_storage_ptr__->
             super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>).
             _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - (lVar9 - 1U) !=
      0) {
    std::vector<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>::resize
              (__return_storage_ptr__,lVar9 - 1U);
  }
  pTVar5 = (__return_storage_ptr__->
           super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  MPI_Bcast(pTVar5,(int)((ulong)((long)(__return_storage_ptr__->
                                       super__Vector_base<TwoBSA<unsigned_long>,_std::allocator<TwoBSA<unsigned_long>_>_>
                                       )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar5)
                        >> 3) * -0x55555555,local_80,0,*(undefined8 *)(param_5 + 8));
  if (local_70._vptr_custom_op != (_func_int **)0x0) {
    operator_delete(local_70._vptr_custom_op);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<typename std::iterator_traits<_Iterator>::value_type>
sample_arbit_decomp(_Iterator begin, _Iterator end, _Compare comp, int s, const mxx::comm& comm, MPI_Datatype mpi_dt) {
    typedef typename std::iterator_traits<_Iterator>::value_type value_type;
    std::size_t local_size = std::distance(begin, end);

    // get total size n
    std::size_t total_size = mxx::allreduce(local_size, comm);

    // p = number of processes
    int p = comm.size();

    //  pick a total of s*p samples, thus locally pick ceil((local_size/n)*s*p)
    //  and at least one samples from each processor.
    //  this will result in at least s*p samples.
    std::size_t local_s;
    if (local_size == 0)
        local_s = 0;
    else
        local_s = std::max<std::size_t>(((local_size*s*p)+total_size-1)/total_size, 1);

    //. init samples
    std::vector<value_type> local_splitters;

    // pick local samples
    if (local_s > 0) {
        local_splitters.resize(local_s);
        _Iterator pos = begin;
        for (std::size_t i = 0; i < local_splitters.size(); ++i)
        {
            std::size_t bucket_size = local_size / (local_s+1) + (i < (local_size % (local_s+1)) ? 1 : 0);
            // pick last element of each bucket
            pos += (bucket_size-1);
            local_splitters[i] = *pos;
            ++pos;
        }
    }

    // 2. gather samples to `rank = 0`
    // - TODO: rather call sample sort
    //         recursively and implement a base case for samplesort which does
    //         gather to rank=0, local sort and redistribute
    std::vector<value_type> all_samples = mxx::gatherv(local_splitters, 0, comm);

    // sort and pick p-1 samples on master
    if (comm.rank() == 0) {
        // 3. local sort on master
        std::sort(all_samples.begin(), all_samples.end(), comp);

        // 4. pick p-1 splitters and broadcast them
        if (local_splitters.size() != (size_t) p-1)
        {
            local_splitters.resize(p-1);
        }
        // split into `p` pieces and choose the `p-1` splitting elements
        _Iterator pos = all_samples.begin();
        for (std::size_t i = 0; i < local_splitters.size(); ++i)
        {
            std::size_t bucket_size = (p*s) / p + (i < static_cast<std::size_t>((p*s) % p) ? 1 : 0);
            // pick last element of each bucket
            local_splitters[i] = *(pos + (bucket_size-1));
            pos += bucket_size;
        }
    }

    // size splitters for receiving
    if (local_splitters.size() != (size_t)p-1) {
        local_splitters.resize(p-1);
    }

    // 4. broadcast and receive final splitters
    MPI_Bcast(&local_splitters[0], local_splitters.size(), mpi_dt, 0, comm);

    return local_splitters;
}